

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

bool __thiscall Assimp::X3DImporter::XML_SearchNode(X3DImporter *this,string *pNodeName)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer pFVar4;
  string *pNodeName_local;
  X3DImporter *this_local;
  
  do {
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
    if ((uVar2 & 1) == 0) {
      return false;
    }
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
  } while ((iVar3 != 1) || (bVar1 = XML_CheckNode_NameEqual(this,pNodeName), !bVar1));
  return true;
}

Assistant:

bool X3DImporter::XML_SearchNode(const std::string& pNodeName)
{
	while(mReader->read())
	{
		if((mReader->getNodeType() == irr::io::EXN_ELEMENT) && XML_CheckNode_NameEqual(pNodeName)) return true;
	}

	return false;
}